

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool art_internal_validate_at(art_t *art,art_ref_t ref,art_internal_validate_t validator)

{
  long lVar1;
  long lVar2;
  byte bVar3;
  bool bVar4;
  art_internal_validate_t validator_00;
  art_internal_validate_t validator_01;
  art_internal_validate_t validator_02;
  art_internal_validate_t validator_03;
  art_validate_cb_t p_Var5;
  void *pvVar6;
  _Bool _Var7;
  int iVar8;
  char **ppcVar9;
  ulong uVar10;
  char *pcVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  byte *pbVar19;
  long lVar20;
  bool bVar21;
  undefined8 uStack_70;
  art_key_chunk_t local_68;
  art_key_chunk_t aStack_67;
  undefined6 uStack_66;
  byte *local_58;
  ulong local_50;
  art_t *local_48;
  byte *local_40;
  byte *local_38;
  
  iVar8 = validator.depth;
  ppcVar9 = validator.reason;
  if (ref == 0) {
    pcVar11 = "node is null";
  }
  else {
    uVar16 = (ulong)(uint)((int)(ref & 0xff) * 8);
    lVar18 = *(long *)((long)art->nodes + uVar16);
    lVar15 = (ref >> 0x10) * *(long *)((long)ART_NODE_SIZES + uVar16);
    pbVar19 = (byte *)(lVar18 + lVar15);
    if ((ref & 0xff) == 1) {
      uVar16 = (ulong)(byte)validator.depth;
      validator.depth = iVar8;
      iVar8 = bcmp(pbVar19,validator.current_key,uVar16);
      ppcVar9 = validator.reason;
      if (iVar8 == 0) {
        if (validator.validate_cb == (art_validate_cb_t)0x0) {
          return true;
        }
        _Var7 = (*validator.validate_cb)
                          (*(art_val_t *)(pbVar19 + 8),validator.reason,validator.context);
        if (!_Var7) {
          if (*ppcVar9 != (char *)0x0) {
            return false;
          }
          *ppcVar9 = "leaf validation failed";
          return false;
        }
        return true;
      }
      pcVar11 = "leaf key does not match its position\'s prefix in the tree";
    }
    else {
      bVar3 = *pbVar19;
      if ((int)(validator.depth + (uint)bVar3) < 6) {
        local_48 = art;
        memcpy(validator.current_key + validator.depth,pbVar19 + 1,(ulong)bVar3);
        pvVar6 = validator.context;
        p_Var5 = validator.validate_cb;
        ppcVar9 = validator.reason;
        validator.depth = validator.depth + (uint)bVar3;
        local_58 = pbVar19;
        switch((uint)ref & 0xff) {
        case 2:
          local_68 = validator.current_key[4];
          aStack_67 = validator.current_key[5];
          uStack_66 = validator._34_6_;
          bVar3 = pbVar19[6];
          if (bVar3 == 0) {
            pcVar11 = "Node4 has no children";
          }
          else if (bVar3 < 5) {
            if (bVar3 != 1) {
              uStack_70 = CONCAT44(validator.current_key._0_4_,validator.depth + 1);
              local_38 = pbVar19 + 7;
              local_40 = pbVar19 + 0x10;
              lVar18 = lVar15 + 0x20 + lVar18;
              lVar17 = 1;
              lVar15 = -1;
              lVar20 = -2;
              uVar16 = 0;
              do {
                uVar10 = uVar16;
                pbVar19 = local_58;
                local_50 = (ulong)local_58[6];
                if (local_50 <= uVar10) {
                  return true;
                }
                if ((uVar10 != 0) && (local_38[uVar10] <= local_38[uVar10 - 1])) {
                  *ppcVar9 = "Node4 keys are not strictly increasing";
                  break;
                }
                bVar21 = uVar10 + 1 < local_50;
                if (bVar21) {
                  if (*(long *)(local_40 + uVar10 * 8) != *(long *)(local_40 + lVar17 * 8)) {
                    lVar13 = 0;
                    do {
                      if (local_50 + lVar20 == lVar13) goto LAB_00105bbf;
                      lVar1 = lVar13 + 1;
                      lVar2 = lVar13 * 8;
                      lVar13 = lVar1;
                    } while (*(long *)(local_40 + uVar10 * 8) != *(long *)(lVar18 + lVar2));
                    bVar21 = (ulong)(lVar1 - lVar15) < local_50;
                  }
                  *ppcVar9 = "Node4 has duplicate children";
                  if (bVar21) break;
                }
LAB_00105bbf:
                *(byte *)((long)&uStack_70 + (long)(int)uStack_70 + 3) = local_58[uVar10 + 7];
                validator_03.validate_cb = p_Var5;
                validator_03.reason = ppcVar9;
                validator_03.context = pvVar6;
                validator_03.depth = (int)uStack_70;
                validator_03.current_key[0] = uStack_70._4_1_;
                validator_03.current_key[1] = uStack_70._5_1_;
                validator_03.current_key[2] = uStack_70._6_1_;
                validator_03.current_key[3] = uStack_70._7_1_;
                validator_03.current_key[4] = local_68;
                validator_03.current_key[5] = aStack_67;
                validator_03._34_6_ = uStack_66;
                _Var7 = art_internal_validate_at
                                  (local_48,*(art_ref_t *)(pbVar19 + uVar10 * 8 + 0x10),validator_03
                                  );
                lVar17 = lVar17 + 1;
                lVar15 = lVar15 + -1;
                lVar18 = lVar18 + 8;
                lVar20 = lVar20 + -1;
                uVar16 = uVar10 + 1;
              } while (_Var7);
              if (uVar10 < local_50) {
                return false;
              }
              return true;
            }
            pcVar11 = "Node4 and child node should have been combined";
          }
          else {
            pcVar11 = "Node4 has too many children";
          }
          break;
        case 3:
          local_68 = validator.current_key[4];
          aStack_67 = validator.current_key[5];
          uStack_66 = validator._34_6_;
          if (pbVar19[6] < 5) {
            pcVar11 = "Node16 has too few children";
          }
          else {
            if (pbVar19[6] < 0x11) {
              uStack_70 = CONCAT44(validator.current_key._0_4_,validator.depth + 1);
              local_38 = pbVar19 + 7;
              local_40 = pbVar19 + 0x18;
              lVar18 = lVar15 + 0x28 + lVar18;
              lVar15 = 1;
              lVar17 = -1;
              lVar20 = -2;
              uVar16 = 0;
              do {
                uVar10 = uVar16;
                pbVar19 = local_58;
                local_50 = (ulong)local_58[6];
                if (local_50 <= uVar10) {
                  return true;
                }
                if ((uVar10 != 0) && (local_38[uVar10] <= local_38[uVar10 - 1])) {
                  *ppcVar9 = "Node16 keys are not strictly increasing";
                  break;
                }
                bVar21 = uVar10 + 1 < local_50;
                if (bVar21) {
                  if (*(long *)(local_40 + uVar10 * 8) != *(long *)(local_40 + lVar15 * 8)) {
                    lVar13 = 0;
                    do {
                      if (local_50 + lVar20 == lVar13) goto LAB_00105a66;
                      lVar1 = lVar13 + 1;
                      lVar2 = lVar13 * 8;
                      lVar13 = lVar1;
                    } while (*(long *)(local_40 + uVar10 * 8) != *(long *)(lVar18 + lVar2));
                    bVar21 = (ulong)(lVar1 - lVar17) < local_50;
                  }
                  *ppcVar9 = "Node16 has duplicate children";
                  if (bVar21) break;
                }
LAB_00105a66:
                *(byte *)((long)&uStack_70 + (long)(int)uStack_70 + 3) = local_58[uVar10 + 7];
                validator_02.validate_cb = p_Var5;
                validator_02.reason = ppcVar9;
                validator_02.context = pvVar6;
                validator_02.depth = (int)uStack_70;
                validator_02.current_key[0] = uStack_70._4_1_;
                validator_02.current_key[1] = uStack_70._5_1_;
                validator_02.current_key[2] = uStack_70._6_1_;
                validator_02.current_key[3] = uStack_70._7_1_;
                validator_02.current_key[4] = local_68;
                validator_02.current_key[5] = aStack_67;
                validator_02._34_6_ = uStack_66;
                _Var7 = art_internal_validate_at
                                  (local_48,*(art_ref_t *)(pbVar19 + uVar10 * 8 + 0x18),validator_02
                                  );
                lVar15 = lVar15 + 1;
                lVar17 = lVar17 + -1;
                lVar18 = lVar18 + 8;
                lVar20 = lVar20 + -1;
                uVar16 = uVar10 + 1;
              } while (_Var7);
              if (uVar10 < local_50) {
                return false;
              }
              return true;
            }
            pcVar11 = "Node16 has too many children";
          }
          break;
        case 4:
          local_68 = validator.current_key[4];
          aStack_67 = validator.current_key[5];
          uStack_66 = validator._34_6_;
          if (pbVar19[6] < 0x11) {
            pcVar11 = "Node48 has too few children";
          }
          else if (pbVar19[6] < 0x31) {
            uVar16 = 0;
            bVar21 = false;
            uVar10 = 0;
            do {
              uVar12 = (ulong)pbVar19[uVar16 + 0x10];
              bVar4 = true;
              if (uVar12 != 0x30) {
                if ((uVar10 >> (uVar12 & 0x3f) & 1) == 0) {
                  bVar4 = *(long *)(pbVar19 + uVar12 * 8 + 0x110) != 0;
                  if (*(long *)(pbVar19 + uVar12 * 8 + 0x110) == 0) {
                    *validator.reason = "Node48 has a NULL child";
                  }
                  else {
                    uVar10 = uVar10 | 1L << (pbVar19[uVar16 + 0x10] & 0x3f);
                  }
                }
                else {
                  *validator.reason = "Node48 keys point to the same child index";
                  bVar4 = false;
                }
              }
              if (!bVar4) break;
              bVar21 = 0xfe < uVar16;
              uVar16 = uVar16 + 1;
            } while (uVar16 != 0x100);
            if (!bVar21) {
              return false;
            }
            if ((*(ulong *)(pbVar19 + 8) ^ uVar10) == 0xffffffffffff) {
              do {
                if (uVar10 == 0) {
                  uStack_70 = CONCAT44(validator.current_key._0_4_,validator.depth + 1);
                  uVar16 = 0;
                  bVar21 = false;
                  do {
                    pbVar19 = local_58;
                    bVar3 = local_58[uVar16 + 0x10];
                    if ((ulong)bVar3 != 0x30) {
                      *(char *)((long)&uStack_70 + (long)(int)uStack_70 + 3) = (char)uVar16;
                      validator_00.validate_cb = p_Var5;
                      validator_00.reason = ppcVar9;
                      validator_00.context = pvVar6;
                      validator_00.depth = (int)uStack_70;
                      validator_00.current_key[0] = uStack_70._4_1_;
                      validator_00.current_key[1] = uStack_70._5_1_;
                      validator_00.current_key[2] = uStack_70._6_1_;
                      validator_00.current_key[3] = uStack_70._7_1_;
                      validator_00.current_key[4] = local_68;
                      validator_00.current_key[5] = aStack_67;
                      validator_00._34_6_ = uStack_66;
                      _Var7 = art_internal_validate_at
                                        (local_48,*(art_ref_t *)(pbVar19 + (ulong)bVar3 * 8 + 0x110)
                                         ,validator_00);
                      if (!_Var7) {
                        if (bVar21) {
                          return true;
                        }
                        return false;
                      }
                    }
                    bVar21 = 0xfe < uVar16;
                    uVar16 = uVar16 + 1;
                  } while (uVar16 != 0x100);
                  return true;
                }
                lVar18 = 0;
                if (uVar10 != 0) {
                  for (; (uVar10 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
                  }
                }
                uVar10 = uVar10 - 1 & uVar10;
                for (uVar16 = uVar10; uVar16 != 0; uVar16 = uVar16 & uVar16 - 1) {
                  lVar15 = 0;
                  if (uVar16 != 0) {
                    for (; (uVar16 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
                    }
                  }
                  if (*(long *)(pbVar19 + lVar18 * 8 + 0x110) ==
                      *(long *)(pbVar19 + lVar15 * 8 + 0x110)) {
                    *validator.reason = "Node48 has duplicate children";
                    return false;
                  }
                }
              } while( true );
            }
            pcVar11 = "Node48 available_children does not match actual children";
          }
          else {
            pcVar11 = "Node48 has too many children";
          }
          break;
        case 5:
          local_68 = validator.current_key[4];
          aStack_67 = validator.current_key[5];
          uStack_66 = validator._34_6_;
          if (*(ushort *)(pbVar19 + 6) < 0x31) {
            pcVar11 = "Node256 has too few children";
          }
          else if (*(ushort *)(pbVar19 + 6) < 0x101) {
            uStack_70 = CONCAT44(validator.current_key._0_4_,validator.depth + 1);
            uVar16 = 0;
            bVar21 = false;
            uVar14 = 0;
            do {
              if (*(long *)(local_58 + uVar16 * 8 + 8) != 0) {
                uVar14 = uVar14 + 1;
                uVar10 = uVar16;
                while (uVar10 != 0xff) {
                  lVar17 = uVar10 * 8;
                  uVar10 = uVar10 + 1;
                  if (*(long *)(local_58 + uVar16 * 8 + 8) ==
                      *(long *)(lVar18 + 0x10 + lVar15 + lVar17)) {
                    *ppcVar9 = "Node256 has duplicate children";
                    goto LAB_00105ace;
                  }
                }
                *(char *)((long)&uStack_70 + (long)(int)uStack_70 + 3) = (char)uVar16;
                validator_01.validate_cb = p_Var5;
                validator_01.reason = ppcVar9;
                validator_01.context = pvVar6;
                validator_01.depth = (int)uStack_70;
                validator_01.current_key[0] = uStack_70._4_1_;
                validator_01.current_key[1] = uStack_70._5_1_;
                validator_01.current_key[2] = uStack_70._6_1_;
                validator_01.current_key[3] = uStack_70._7_1_;
                validator_01.current_key[4] = local_68;
                validator_01.current_key[5] = aStack_67;
                validator_01._34_6_ = uStack_66;
                _Var7 = art_internal_validate_at
                                  (local_48,*(art_ref_t *)(local_58 + uVar16 * 8 + 8),validator_01);
                if (!_Var7) break;
              }
              bVar21 = 0xfe < uVar16;
              uVar16 = uVar16 + 1;
            } while (uVar16 != 0x100);
LAB_00105ace:
            if (!bVar21) {
              return false;
            }
            if (uVar14 == *(ushort *)(local_58 + 6)) {
              return true;
            }
            pcVar11 = "Node256 count does not match actual children";
          }
          else {
            pcVar11 = "Node256 has too many children";
          }
          break;
        default:
          pcVar11 = "invalid node type";
        }
      }
      else {
        pcVar11 = "node has too much prefix at given depth";
      }
    }
  }
  *ppcVar9 = pcVar11;
  return false;
}

Assistant:

static bool art_internal_validate_at(const art_t *art, art_ref_t ref,
                                     art_internal_validate_t validator) {
    if (ref == CROARING_ART_NULL_REF) {
        return art_validate_fail(&validator, "node is null");
    }
    if (art_is_leaf(ref)) {
        art_leaf_t *leaf = (art_leaf_t *)art_deref(art, ref);
        if (art_compare_prefix(leaf->key, 0, validator.current_key, 0,
                               validator.depth) != 0) {
            return art_validate_fail(&validator,
                                     "leaf key does not match its "
                                     "position's prefix in the tree");
        }
        if (validator.validate_cb != NULL &&
            !validator.validate_cb(leaf->val, validator.reason,
                                   validator.context)) {
            if (*validator.reason == NULL) {
                *validator.reason = "leaf validation failed";
            }
            return false;
        }
    } else {
        art_inner_node_t *inner_node = (art_inner_node_t *)art_deref(art, ref);

        if (validator.depth + inner_node->prefix_size + 1 > ART_KEY_BYTES) {
            return art_validate_fail(&validator,
                                     "node has too much prefix at given depth");
        }
        memcpy(validator.current_key + validator.depth, inner_node->prefix,
               inner_node->prefix_size);
        validator.depth += inner_node->prefix_size;

        switch (art_ref_typecode(ref)) {
            case CROARING_ART_NODE4_TYPE:
                if (!art_node4_internal_validate(art, (art_node4_t *)inner_node,
                                                 validator)) {
                    return false;
                }
                break;
            case CROARING_ART_NODE16_TYPE:
                if (!art_node16_internal_validate(
                        art, (art_node16_t *)inner_node, validator)) {
                    return false;
                }
                break;
            case CROARING_ART_NODE48_TYPE:
                if (!art_node48_internal_validate(
                        art, (art_node48_t *)inner_node, validator)) {
                    return false;
                }
                break;
            case CROARING_ART_NODE256_TYPE:
                if (!art_node256_internal_validate(
                        art, (art_node256_t *)inner_node, validator)) {
                    return false;
                }
                break;
            default:
                return art_validate_fail(&validator, "invalid node type");
        }
    }
    return true;
}